

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O3

void aom_highbd_dc_predictor_32x16_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  uint16_t *puVar1;
  undefined1 auVar2 [16];
  int iVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  auVar7 = *(undefined1 (*) [16])left;
  auVar9 = *(undefined1 (*) [16])(left + 8);
  auVar8._0_2_ = auVar7._8_2_ + auVar7._0_2_;
  auVar8._2_2_ = auVar7._10_2_ + auVar7._2_2_;
  auVar8._4_2_ = auVar7._12_2_ + auVar7._4_2_;
  auVar8._6_2_ = auVar7._14_2_ + auVar7._6_2_;
  auVar8._8_2_ = auVar7._8_2_;
  auVar8._10_2_ = auVar7._10_2_;
  auVar8._12_2_ = auVar7._12_2_;
  auVar8._14_2_ = auVar7._14_2_;
  auVar5 = pshuflw(auVar7,auVar8,0xe);
  auVar10._0_2_ = auVar9._8_2_ + auVar9._0_2_;
  auVar10._2_2_ = auVar9._10_2_ + auVar9._2_2_;
  auVar10._4_2_ = auVar9._12_2_ + auVar9._4_2_;
  auVar10._6_2_ = auVar9._14_2_ + auVar9._6_2_;
  auVar10._8_2_ = auVar9._8_2_;
  auVar10._10_2_ = auVar9._10_2_;
  auVar10._12_2_ = auVar9._12_2_;
  auVar10._14_2_ = auVar9._14_2_;
  auVar6 = pshuflw(auVar9,auVar10,0xe);
  auVar7 = *(undefined1 (*) [16])above;
  auVar9 = *(undefined1 (*) [16])(above + 8);
  auVar13 = *(undefined1 (*) [16])(above + 0x10);
  auVar2 = *(undefined1 (*) [16])(above + 0x18);
  auVar14._0_2_ = auVar7._8_2_ + auVar7._0_2_;
  auVar14._2_2_ = auVar7._10_2_ + auVar7._2_2_;
  auVar14._4_2_ = auVar7._12_2_ + auVar7._4_2_;
  auVar14._6_2_ = auVar7._14_2_ + auVar7._6_2_;
  auVar14._8_2_ = auVar7._8_2_;
  auVar14._10_2_ = auVar7._10_2_;
  auVar14._12_2_ = auVar7._12_2_;
  auVar14._14_2_ = auVar7._14_2_;
  auVar7 = pshuflw(auVar7,auVar14,0xe);
  auVar16._0_2_ = auVar9._8_2_ + auVar9._0_2_;
  auVar16._2_2_ = auVar9._10_2_ + auVar9._2_2_;
  auVar16._4_2_ = auVar9._12_2_ + auVar9._4_2_;
  auVar16._6_2_ = auVar9._14_2_ + auVar9._6_2_;
  auVar16._8_2_ = auVar9._8_2_;
  auVar16._10_2_ = auVar9._10_2_;
  auVar16._12_2_ = auVar9._12_2_;
  auVar16._14_2_ = auVar9._14_2_;
  auVar11 = pshuflw(auVar9,auVar16,0xe);
  auVar12._0_2_ = auVar13._8_2_ + auVar13._0_2_;
  auVar12._2_2_ = auVar13._10_2_ + auVar13._2_2_;
  auVar12._4_2_ = auVar13._12_2_ + auVar13._4_2_;
  auVar12._6_2_ = auVar13._14_2_ + auVar13._6_2_;
  auVar12._8_2_ = auVar13._8_2_;
  auVar12._10_2_ = auVar13._10_2_;
  auVar12._12_2_ = auVar13._12_2_;
  auVar12._14_2_ = auVar13._14_2_;
  auVar13 = pshuflw(auVar13,auVar12,0xe);
  auVar15._0_2_ = auVar2._8_2_ + auVar2._0_2_;
  auVar15._2_2_ = auVar2._10_2_ + auVar2._2_2_;
  auVar15._4_2_ = auVar2._12_2_ + auVar2._4_2_;
  auVar15._6_2_ = auVar2._14_2_ + auVar2._6_2_;
  auVar15._8_2_ = auVar2._8_2_;
  auVar15._10_2_ = auVar2._10_2_;
  auVar15._12_2_ = auVar2._12_2_;
  auVar15._14_2_ = auVar2._14_2_;
  auVar9 = pshuflw(auVar2,auVar15,0xe);
  auVar7 = ZEXT416(((uint)(ushort)(auVar5._0_2_ + auVar8._0_2_ + auVar6._0_2_ + auVar10._0_2_ +
                                   auVar5._2_2_ + auVar8._2_2_ + auVar6._2_2_ + auVar10._2_2_) +
                    (uint)(ushort)(auVar7._0_2_ + auVar14._0_2_ + auVar11._0_2_ + auVar16._0_2_ +
                                   auVar7._2_2_ + auVar14._2_2_ + auVar11._2_2_ + auVar16._2_2_) +
                    (uint)(ushort)(auVar13._0_2_ + auVar12._0_2_ + auVar9._0_2_ + auVar15._0_2_ +
                                   auVar13._2_2_ + auVar12._2_2_ + auVar9._2_2_ + auVar15._2_2_) +
                   0x18) / 0x30);
  auVar7 = pshuflw(auVar7,auVar7,0);
  uVar4 = auVar7._0_4_;
  iVar3 = 4;
  do {
    *(undefined4 *)dst = uVar4;
    *(undefined4 *)(dst + 2) = uVar4;
    *(undefined4 *)(dst + 4) = uVar4;
    *(undefined4 *)(dst + 6) = uVar4;
    *(undefined4 *)(dst + 8) = uVar4;
    *(undefined4 *)(dst + 10) = uVar4;
    *(undefined4 *)(dst + 0xc) = uVar4;
    *(undefined4 *)(dst + 0xe) = uVar4;
    *(undefined4 *)(dst + 0x10) = uVar4;
    *(undefined4 *)(dst + 0x12) = uVar4;
    *(undefined4 *)(dst + 0x14) = uVar4;
    *(undefined4 *)(dst + 0x16) = uVar4;
    *(undefined4 *)(dst + 0x18) = uVar4;
    *(undefined4 *)(dst + 0x1a) = uVar4;
    *(undefined4 *)(dst + 0x1c) = uVar4;
    *(undefined4 *)(dst + 0x1e) = uVar4;
    puVar1 = dst + stride;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride + 8;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride + 0x10;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride + 0x18;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride * 2;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride * 2 + 8;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride * 2 + 0x10;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride * 2 + 0x18;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride * 3;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride * 3 + 8;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride * 3 + 0x10;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = dst + stride * 3 + 0x18;
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    dst = dst + stride * 4;
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  return;
}

Assistant:

void aom_highbd_dc_predictor_32x16_sse2(uint16_t *dst, ptrdiff_t stride,
                                        const uint16_t *above,
                                        const uint16_t *left, int bd) {
  (void)bd;
  __m128i sum_left = dc_sum_16(left);
  __m128i sum_above = dc_sum_32(above);
  const __m128i zero = _mm_setzero_si128();
  sum_left = _mm_unpacklo_epi16(sum_left, zero);
  const __m128i sum = _mm_add_epi32(sum_left, sum_above);
  uint32_t sum32 = (uint32_t)_mm_cvtsi128_si32(sum);
  sum32 += 24;
  sum32 /= 48;
  const __m128i row = _mm_set1_epi16((int16_t)sum32);
  int i;
  for (i = 0; i < 4; ++i) {
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    _mm_store_si128((__m128i *)(dst + 16), row);
    _mm_store_si128((__m128i *)(dst + 24), row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    _mm_store_si128((__m128i *)(dst + 16), row);
    _mm_store_si128((__m128i *)(dst + 24), row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    _mm_store_si128((__m128i *)(dst + 16), row);
    _mm_store_si128((__m128i *)(dst + 24), row);
    dst += stride;
    _mm_store_si128((__m128i *)dst, row);
    _mm_store_si128((__m128i *)(dst + 8), row);
    _mm_store_si128((__m128i *)(dst + 16), row);
    _mm_store_si128((__m128i *)(dst + 24), row);
    dst += stride;
  }
}